

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall
TCMallocTest_AggressiveDecommit_Test::TestBody(TCMallocTest_AggressiveDecommit_Test *this)

{
  bool bVar1;
  TestingPortal *pTVar2;
  ulong uVar3;
  long *plVar4;
  void *pvVar5;
  void *pvVar6;
  char *pcVar7;
  AssertHelper local_130;
  Message local_128;
  size_t local_120;
  unsigned_long local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_4;
  Message local_f8;
  size_t local_f0;
  unsigned_long local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  size_t local_c0;
  unsigned_long local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  size_t local_90;
  unsigned_long local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  size_t starting_bytes;
  void *b;
  void *a;
  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
  cleanup;
  TCMallocTest_AggressiveDecommit_Test *this_local;
  
  cleanup.callback_.name = (char *)this;
  pTVar2 = tcmalloc::TestingPortal::Get();
  uVar3 = (**(code **)(*(long *)pTVar2 + 8))();
  if ((uVar3 & 1) == 0) {
    pTVar2 = tcmalloc::TestingPortal::Get();
    uVar3 = (*(code *)**(undefined8 **)pTVar2)();
    if ((uVar3 & 1) != 0) {
      printf("Testing aggressive de-commit\n");
      plVar4 = (long *)MallocExtension::instance();
      (**(code **)(*plVar4 + 0x90))();
      anon_unknown.dwarf_15b4e::NumericProperty::Override((NumericProperty *)&a,0x1bded0);
      pvVar5 = malloc(0x100000);
      pvVar5 = noopt<void*>(pvVar5);
      pvVar6 = malloc(0x100000);
      pvVar6 = noopt<void*>(pvVar6);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )GetUnmappedBytes();
      plVar4 = (long *)MallocExtension::instance();
      (**(code **)(*plVar4 + 0x88))(plVar4,0x100000);
      local_60 = GetUnmappedBytes();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_58,"starting_bytes","GetUnmappedBytes()",
                 (unsigned_long *)&gtest_ar.message_,&local_60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
      if (!bVar1) {
        testing::Message::Message(&local_68);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x42b,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_68);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
      free(pvVar5);
      local_88 = (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x100000;
      local_90 = GetUnmappedBytes();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_80,"starting_bytes + MB","GetUnmappedBytes()",&local_88,&local_90
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x430,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_98);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
      free(pvVar6);
      local_b8 = (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x200000;
      local_c0 = GetUnmappedBytes();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_b0,"starting_bytes + 2*MB","GetUnmappedBytes()",&local_b8,
                 &local_c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
      if (!bVar1) {
        testing::Message::Message(&local_c8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x434,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
      plVar4 = (long *)MallocExtension::instance();
      (**(code **)(*plVar4 + 0x90))();
      local_e8 = (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x200000;
      local_f0 = GetUnmappedBytes();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_e0,"starting_bytes + 2*MB","GetUnmappedBytes()",&local_e8,
                 &local_f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x438,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      pvVar5 = malloc(0x100000);
      pvVar5 = noopt<void*>(pvVar5);
      free(pvVar5);
      local_118 = (long)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0x200000;
      local_120 = GetUnmappedBytes();
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_110,"starting_bytes + 2*MB","GetUnmappedBytes()",&local_118,
                 &local_120);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                   ,0x43d,pcVar7);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      printf("Done testing aggressive de-commit\n");
      tcmalloc::
      Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:151:30)>
      ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
                  *)&a);
    }
  }
  return;
}

Assistant:

TEST(TCMallocTest, AggressiveDecommit) {
  // Debug allocation mode adds overhead to each allocation which
  // messes up all the equality tests here.  I just disable the
  // teset in this mode.
  if(TestingPortal::Get()->IsDebuggingMalloc() || !TestingPortal::Get()->HaveSystemRelease()) {
    return;
  }

  printf("Testing aggressive de-commit\n");

  MallocExtension::instance()->ReleaseFreeMemory();

  tcmalloc::Cleanup cleanup = kAggressiveDecommit.Override(1);

  static const int MB = 1048576;
  void* a = noopt(malloc(MB));
  void* b = noopt(malloc(MB));

  size_t starting_bytes = GetUnmappedBytes();

  // ReleaseToSystem shouldn't do anything either.
  MallocExtension::instance()->ReleaseToSystem(MB);
  EXPECT_EQ(starting_bytes, GetUnmappedBytes());

  free(a);

  // The span to release should be 1MB.
  EXPECT_EQ(starting_bytes + MB, GetUnmappedBytes());

  free(b);

  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  // Nothing else to release.
  MallocExtension::instance()->ReleaseFreeMemory();
  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  a = noopt(malloc(MB));
  free(a);

  EXPECT_EQ(starting_bytes + 2*MB, GetUnmappedBytes());

  printf("Done testing aggressive de-commit\n");
}